

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEdgePtr ON_SubDEdge::FromVertices(ON_SubDVertex *vertex0,ON_SubDVertex *vertex1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((((vertex0 != vertex1) && (vertex0 != (ON_SubDVertex *)0x0)) &&
      (vertex1 != (ON_SubDVertex *)0x0)) &&
     ((vertex0->m_edges != (ON_SubDEdgePtr *)0x0 && ((ulong)vertex0->m_edge_count != 0)))) {
    uVar2 = 0;
    do {
      uVar1 = vertex0->m_edges[uVar2].m_ptr;
      uVar3 = uVar1 & 0xfffffffffffffff8;
      if (((uVar3 != 0) &&
          (uVar4 = (uint)uVar1 & 1,
          *(ON_SubDVertex **)(uVar3 + 0x80 + (ulong)(uVar4 ^ 1) * 8) == vertex1)) &&
         (*(ON_SubDVertex **)(uVar3 + 0x80 + (ulong)uVar4 * 8) == vertex0)) {
        return (ON_SubDEdgePtr)uVar1;
      }
      uVar2 = uVar2 + 1;
    } while (vertex0->m_edge_count != uVar2);
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubDEdge::FromVertices(
  const ON_SubDVertex* vertex0,
  const ON_SubDVertex* vertex1
)
{
  if (nullptr != vertex0 && nullptr != vertex1 && vertex0 != vertex1 && nullptr != vertex0->m_edges)
  {
    for (unsigned short vei = 0; vei < vertex0->m_edge_count; vei++)
    {
      const ON_SubDEdgePtr eptr = vertex0->m_edges[vei];
      if (vertex1 == eptr.RelativeVertex(1) && vertex0 == eptr.RelativeVertex(0))
        return eptr;
    }
  }
  return ON_SubDEdgePtr::Null;
}